

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

Symbol __thiscall
google::protobuf::FileDescriptorTables::FindNestedSymbol
          (FileDescriptorTables *this,void *parent,string *name)

{
  unordered_map<std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>_>_>
  *collection;
  second_type *psVar1;
  first_type *in_RDI;
  Symbol SVar2;
  Symbol *result;
  pair<const_void_*,_const_char_*> local_40 [2];
  void *local_20 [2];
  ulong local_10;
  anon_union_8_8_13f84498_for_Symbol_2 local_8;
  
  collection = (unordered_map<std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>_>_>
                *)std::__cxx11::string::c_str();
  std::pair<const_void_*,_const_char_*>::pair<const_void_*&,_const_char_*,_true>
            (local_40,local_20,(char **)&stack0xffffffffffffffb8);
  psVar1 = FindOrNull<std::unordered_map<std::pair<void_const*,char_const*>,google::protobuf::Symbol,google::protobuf::(anonymous_namespace)::PointerStringPairHash,google::protobuf::(anonymous_namespace)::PointerStringPairEqual,std::allocator<std::pair<std::pair<void_const*,char_const*>const,google::protobuf::Symbol>>>>
                     (collection,in_RDI);
  if (psVar1 == (second_type *)0x0) {
    local_10 = (anonymous_namespace)::kNullSymbol;
    local_8 = DAT_00ae0588;
  }
  else {
    local_10 = *(ulong *)psVar1;
    local_8 = (anon_union_8_8_13f84498_for_Symbol_2)(psVar1->field_1).descriptor;
  }
  SVar2._0_8_ = local_10 & 0xffffffff;
  SVar2.field_1.descriptor = local_8.descriptor;
  return SVar2;
}

Assistant:

inline Symbol FileDescriptorTables::FindNestedSymbol(
    const void* parent, const std::string& name) const {
  const Symbol* result = FindOrNull(
      symbols_by_parent_, PointerStringPair(parent, name.c_str()));
  if (result == nullptr) {
    return kNullSymbol;
  } else {
    return *result;
  }
}